

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalNinjaGenerator::AdditionalCleanFiles(cmLocalNinjaGenerator *this,string *config)

{
  cmMakefile *this_00;
  cmGlobalNinjaGenerator *this_01;
  cmValue cVar1;
  string *in_base;
  pointer in_path;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  string local_c8;
  cmList cleanFiles;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"ADDITIONAL_CLEAN_FILES",(allocator<char> *)&local_90);
  cVar1 = cmMakefile::GetProperty(this_00,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  if (cVar1.Value != (string *)0x0) {
    std::__cxx11::string::string((string *)&local_70,(string *)cVar1.Value);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    cmGeneratorExpression::Evaluate
              (&local_c8,&local_70,(cmLocalGenerator *)this,config,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_90);
    init._M_len = 1;
    init._M_array = &local_c8;
    cmList::cmList(&cleanFiles,init);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    in_base = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    this_01 = (cmGlobalNinjaGenerator *)
              (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
    for (in_path = cleanFiles.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        in_path !=
        cleanFiles.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; in_path = in_path + 1) {
      cmsys::SystemTools::CollapseFullPath(&local_50,in_path,in_base);
      cmGlobalNinjaGenerator::AddAdditionalCleanFile(this_01,&local_50,config);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cleanFiles.Values);
  }
  return;
}

Assistant:

void cmLocalNinjaGenerator::AdditionalCleanFiles(const std::string& config)
{
  if (cmValue prop_value =
        this->Makefile->GetProperty("ADDITIONAL_CLEAN_FILES")) {
    cmList cleanFiles{ cmGeneratorExpression::Evaluate(*prop_value, this,
                                                       config) };
    std::string const& binaryDir = this->GetCurrentBinaryDirectory();
    cmGlobalNinjaGenerator* gg = this->GetGlobalNinjaGenerator();
    for (auto const& cleanFile : cleanFiles) {
      // Support relative paths
      gg->AddAdditionalCleanFile(
        cmSystemTools::CollapseFullPath(cleanFile, binaryDir), config);
    }
  }
}